

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int available_hreg_p(int hreg,MIR_reg_t type,int nregs,bitmap_t *conflict_locs,
                    live_range_t_conflict lr)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  byte bVar3;
  uint uVar4;
  long *plVar5;
  bitmap_el_t bVar6;
  MIR_reg_t *pMVar7;
  ulong *puVar8;
  void *pvVar9;
  VARR_MIR_reg_t *pVVar10;
  VARR_spill_cache_el_t *pVVar11;
  spill_cache_el_t *psVar12;
  bitmap_t *ppVVar13;
  VARR_live_range_t *pVVar14;
  undefined8 uVar15;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar16 [32];
  anon_union_32_12_57d33f68_for_u aVar17;
  anon_union_32_12_57d33f68_for_u aVar18;
  undefined1 auVar19 [32];
  anon_union_32_12_57d33f68_for_u aVar20;
  MIR_op_mode_t MVar21;
  MIR_type_t MVar22;
  MIR_reg_t MVar23;
  int iVar24;
  int iVar25;
  gen_ctx_t pgVar26;
  gen_ctx *extraout_RAX;
  MIR_context_t pMVar27;
  bitmap_el_t *pbVar28;
  ra_ctx *prVar29;
  ulong uVar30;
  MIR_insn_t_conflict pMVar31;
  int64_t iVar32;
  MIR_insn_t_conflict insn;
  gen_ctx *pgVar33;
  undefined1 (*pauVar34) [32];
  live_range_t_conflict plVar35;
  MIR_error_func_t p_Var36;
  char cVar37;
  int iVar38;
  int iVar39;
  bitmap_el_t *pbVar40;
  ulong uVar41;
  MIR_insn_t pMVar42;
  long lVar43;
  MIR_disp_t MVar44;
  MIR_reg_t base_reg;
  MIR_reg_t base_reg_00;
  int extraout_EDX;
  undefined4 in_register_00000014;
  undefined8 *puVar45;
  MIR_insn_t extraout_RDX;
  anon_union_32_12_57d33f68_for_u *paVar46;
  char *pcVar47;
  MIR_context_t bm;
  uint uVar48;
  gen_ctx_t pgVar50;
  FILE *pFVar51;
  MIR_error_func_t p_Var52;
  ulong uVar53;
  undefined4 in_register_00000034;
  bitmap_t pVVar54;
  gen_ctx *pgVar55;
  ulong uVar56;
  VARR_bitmap_t *pVVar57;
  code *nb;
  gen_ctx_t pgVar58;
  ulong uVar59;
  MIR_context_t pMVar60;
  gen_ctx_t pgVar61;
  long lVar62;
  undefined8 *puVar63;
  uint uVar64;
  long lVar65;
  gen_ctx_t unaff_R12;
  gen_ctx_t pgVar66;
  uint *puVar67;
  MIR_op_t *pMVar68;
  MIR_context_t unaff_R13;
  uint *puVar69;
  uint *puVar70;
  bitmap_t pVVar71;
  size_t sVar72;
  gen_ctx_t unaff_R15;
  bool bVar73;
  lr_gap_t el;
  MIR_reg_t MStack_440;
  MIR_op_t MStack_3f8;
  ulong *puStack_3c0;
  ulong uStack_3b8;
  bitmap_el_t *pbStack_3b0;
  ulong uStack_3a8;
  gen_ctx_t pgStack_3a0;
  code *pcStack_398;
  uint uStack_2d4;
  uint uStack_2d0;
  int iStack_2cc;
  anon_union_32_12_57d33f68_for_u *paStack_2c8;
  MIR_op_t *pMStack_2c0;
  MIR_insn_t_conflict pMStack_2b8;
  size_t sStack_2b0;
  MIR_insn_t pMStack_2a8;
  MIR_op_t MStack_2a0;
  MIR_op_t MStack_270;
  MIR_op_t MStack_240;
  void *apvStack_210 [2];
  int64_t iStack_200;
  char *pcStack_1f8;
  undefined8 uStack_1f0;
  MIR_disp_t MStack_1e8;
  bitmap_t pVStack_1e0;
  bitmap_t pVStack_1d8;
  bitmap_t pVStack_1d0;
  bitmap_t pVStack_1c8;
  bitmap_t pVStack_1c0;
  bitmap_t pVStack_1b8;
  int aiStack_1b0 [12];
  undefined1 auStack_180 [16];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  gen_ctx_t pgStack_118;
  gen_ctx_t pgStack_110;
  MIR_context_t pMStack_108;
  bitmap_t pVStack_100;
  gen_ctx_t pgStack_f8;
  code *pcStack_f0;
  gen_ctx_t pgStack_e0;
  gen_ctx *pgStack_d8;
  gen_ctx *pgStack_d0;
  MIR_insn_t pMStack_c8;
  MIR_context_t pMStack_c0;
  uint uStack_b4;
  gen_ctx_t pgStack_b0;
  gen_ctx_t pgStack_a8;
  ulong uStack_a0;
  bitmap_el_t *pbStack_98;
  gen_ctx_t pgStack_90;
  gen_ctx_t pgStack_88;
  MIR_context_t pMStack_80;
  ulong uStack_78;
  gen_ctx_t pgStack_70;
  code *pcStack_68;
  gen_ctx *pgStack_60;
  gen_ctx_t pgStack_58;
  gen_ctx_t pgStack_50;
  gen_ctx_t pgVar49;
  
  pgVar55 = (gen_ctx *)CONCAT44(in_register_00000034,type);
  iVar38 = *(int *)(conflict_locs + 1);
  iVar24 = *(int *)((long)conflict_locs + 0xc);
  pbVar40 = (bitmap_el_t *)(long)iVar24;
  iVar25 = 1;
  if (iVar38 <= iVar24) {
    pgVar26 = (gen_ctx_t)(long)hreg;
    uVar53 = 0;
    uVar64 = hreg + 1;
    puVar63 = (undefined8 *)(1L << ((ulong)pgVar26 & 0x3f));
    pgVar58 = (gen_ctx_t)((ulong)pgVar26 >> 6);
    uVar48 = (iVar24 - iVar38) + 1;
    pgVar61 = (gen_ctx_t)(long)iVar38;
    do {
      pgVar49 = (gen_ctx_t)(ulong)uVar48;
      plVar5 = *(long **)(CONCAT44(in_register_00000014,nregs) + (long)pgVar61 * 8);
      if (plVar5 == (long *)0x0) {
        available_hreg_p_cold_1();
        pVVar54 = pgVar58->temp_bitmap;
        uVar30 = 0;
        pgVar26 = pgVar58;
        pgStack_60 = extraout_RAX;
        pgStack_58 = pgVar49;
        pgStack_50 = unaff_R12;
        if ((pVVar54 == (bitmap_t)0x0) || (pVVar54->varr == (bitmap_el_t *)0x0)) goto LAB_0016e225;
        pVVar54->els_num = 0;
        uVar30 = 0;
        unaff_R13 = pgVar55->ctx;
        if (unaff_R13 == (MIR_context_t)0x0) goto LAB_0016e1e5;
        uVar53 = 1;
        pgStack_60 = pgVar55;
        goto LAB_0016e05c;
      }
      unaff_R15 = (gen_ctx_t)(*plVar5 << 6);
      if (((pgVar26 < unaff_R15) &&
          (unaff_R12 = (gen_ctx_t)plVar5[2],
          ((ulong)unaff_R12->call_used_hard_regs[(long)((long)&pgVar58[-1].spot2attr + 3)] &
          (ulong)puVar63) != 0)) ||
         ((1 < (int)type &&
          ((0x21 < uVar64 ||
           (((gen_ctx_t)(ulong)uVar64 < unaff_R15 &&
            ((*(ulong *)plVar5[2] & 1L << ((ulong)uVar64 & 0x3f)) != 0)))))))) break;
      uVar53 = (ulong)((long)pbVar40 <= (long)pgVar61);
      uVar48 = uVar48 - 1;
      pgVar61 = (gen_ctx_t)((long)&pgVar61->ctx + 1);
    } while (uVar48 != 0);
    iVar25 = (int)uVar53;
  }
  return iVar25;
LAB_00170360:
  if ((iVar24 != -1) && (*(int *)((long)pvVar9 + lVar65 + lVar43 + 4) == iVar24)) {
    return *(int *)((long)pvVar9 + lVar65 + 8 + lVar43);
  }
  iVar25 = *(int *)((long)pvVar9 + lVar65 + lVar43 + 8);
  if (uVar64 == 0) {
    iVar39 = 10;
    if (uVar48 < 3) {
      iVar39 = *(int *)(&DAT_001b1a90 + (ulong)uVar48 * 4);
    }
    uVar4 = 1;
    if (iVar25 != iVar39) goto LAB_00170398;
  }
  else {
LAB_00170398:
    iVar39 = 0xb;
    if (uVar48 < 3) {
      iVar39 = *(int *)(&DAT_001b1a9c + (ulong)uVar48 * 4);
    }
    uVar4 = uVar64;
    if (iVar25 == iVar39) {
      uVar4 = 2;
    }
  }
  uVar64 = uVar4;
  lVar65 = lVar65 + 0xc;
  if (lVar62 * 0xc == lVar65) {
    if (1 < uVar64) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
LAB_001703e4:
    if (extraout_EDX == 10) {
      iVar25 = -1;
    }
    else {
      if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
        iVar25 = 0x19;
      }
      else {
        iVar25 = 0xb;
      }
      iVar25 = iVar25 - (uint)(uVar64 == 0);
    }
    *(int *)((long)pvVar9 + uVar53 * 4 + 0x180) = iVar38 + 1;
    if (iVar38 < 8) {
      *(int *)((long)pvVar9 + lVar62 * 0xc + lVar43 + 4) = iVar24;
      *(int *)((long)pvVar9 + lVar62 * 0xc + lVar43) = extraout_EDX;
      *(int *)((long)pvVar9 + lVar62 * 0xc + lVar43 + 8) = iVar25;
      return iVar25;
    }
    __assert_fail("rld_num < (2 * 4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
  }
  goto LAB_00170360;
LAB_0017022a:
  spill_restore_reg_cold_7();
LAB_0017022f:
  __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
  while( true ) {
    pbVar40 = (bitmap_el_t *)((ulong)unaff_R15 >> 6);
    puVar8 = (ulong *)((long)((MIR_insn_t)unaff_R12->curr_func_item)->ops +
                      (long)pbVar40 * 8 + -0x20);
    *puVar8 = *puVar8 | 1L << ((ulong)unaff_R15 & 0x3f);
    unaff_R13 = (MIR_context_t)unaff_R13->c2mir_ctx;
    if (unaff_R13 == (MIR_context_t)0x0) break;
LAB_0016e05c:
    unaff_R12 = (gen_ctx_t)pgVar58->temp_bitmap;
    unaff_R15 = (gen_ctx_t)unaff_R13->gen_ctx->ctx;
    pgVar55 = (gen_ctx *)((long)&unaff_R15->ctx + 1);
    pcStack_68 = (code *)0x16e073;
    pgVar26 = unaff_R12;
    bitmap_expand((bitmap_t)unaff_R12,(size_t)pgVar55);
    if (unaff_R12 == (gen_ctx_t)0x0) {
      pcStack_68 = (code *)0x16e21b;
      gap_lr_spill_cost_cold_3();
      goto LAB_0016e21b;
    }
  }
  pMVar27 = pgStack_60->ctx;
  if (pMVar27 != (MIR_context_t)0x0) {
    uVar30 = 0;
    do {
      pgVar33 = pMVar27->gen_ctx;
      pVVar54 = pgVar33->call_used_hard_regs[6];
      iVar38 = -2;
      do {
        iVar24 = iVar38;
        pVVar54 = (bitmap_t)pVVar54[1].els_num;
        iVar38 = iVar24 + 1;
      } while (pVVar54 != (bitmap_t)0x0);
      if (iVar38 < 0) {
LAB_0016e1f7:
        pcStack_68 = (code *)0x16e216;
        __assert_fail("level >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1748,"int bb_loop_level(bb_t)");
      }
      pgVar55 = (gen_ctx *)pgVar33->addr_regs;
      uVar48 = iVar24 + 2;
      pbVar40 = (bitmap_el_t *)(ulong)uVar48;
      if (pgVar55 != (gen_ctx *)0x0) {
        pgVar61 = (gen_ctx_t)pgVar58->temp_bitmap;
        if (pgVar61 == (gen_ctx_t)0x0) goto LAB_0016e21b;
        pgVar26 = (gen_ctx_t)0xffffffff;
        puVar63 = (undefined8 *)((long)pgVar61->ctx << 6);
        do {
          pMVar42 = ((DLIST_LINK_MIR_insn_t *)&pgVar55->optimize_level)->prev;
          puVar45 = (undefined8 *)pMVar42->data;
          if (puVar45 < puVar63) {
            unaff_R12 = (gen_ctx_t)((ulong)puVar45 >> 6);
            unaff_R15 = *(gen_ctx_t *)
                         ((long)((MIR_insn_t)pgVar61->curr_func_item)->ops +
                         (long)unaff_R12 * 8 + -0x20);
            if (((ulong)unaff_R15 >> ((ulong)puVar45 & 0x3f) & 1) == 0) goto LAB_0016e114;
          }
          else {
LAB_0016e114:
            MVar44 = pMVar42[1].ops[0].u.mem.disp;
            iVar38 = -2;
            do {
              iVar24 = iVar38;
              MVar44 = *(long *)(MVar44 + 0x18);
              iVar38 = iVar24 + 1;
            } while (MVar44 != 0);
            if (iVar38 < 0) goto LAB_0016e1f7;
            if ((int)pgVar26 <= iVar38) {
              pgVar26 = (gen_ctx_t)(ulong)(iVar24 + 2);
            }
          }
          pgVar55 = (gen_ctx *)pgVar55->to_free;
        } while (pgVar55 != (gen_ctx *)0x0);
        if (-1 < (int)pgVar26) {
          if ((int)uVar48 <= (int)pgVar26) {
            pgVar26 = (gen_ctx_t)(ulong)uVar48;
          }
          uVar30 = (ulong)(uint)((int)uVar30 + (int)pgVar26 * 2);
        }
      }
      puVar45 = *(undefined8 **)&pgVar33->addr_insn_p;
      if (puVar45 != (undefined8 *)0x0) {
        pgVar55 = (gen_ctx *)pgVar58->temp_bitmap;
        if (pgVar55 == (gen_ctx *)0x0) goto LAB_0016e220;
        pgVar26 = (gen_ctx_t)0xffffffff;
        pgVar61 = (gen_ctx_t)((long)pgVar55->ctx << 6);
        do {
          puVar63 = (undefined8 *)*puVar45;
          pgVar49 = (gen_ctx_t)*puVar63;
          if ((pgVar61 <= pgVar49) ||
             (unaff_R15 = (gen_ctx_t)((ulong)pgVar49 >> 6),
             (*(ulong *)((long)((MIR_insn_t)pgVar55->curr_func_item)->ops +
                        (long)unaff_R15 * 8 + -0x20) >> ((ulong)pgVar49 & 0x3f) & 1) == 0)) {
            lVar43 = puVar63[0x13];
            puVar63 = (undefined8 *)0xfffffffe;
            do {
              lVar43 = *(long *)(lVar43 + 0x18);
              iVar38 = (int)puVar63;
              uVar64 = iVar38 + 1;
              puVar63 = (undefined8 *)(ulong)uVar64;
            } while (lVar43 != 0);
            if ((int)uVar64 < 0) goto LAB_0016e1f7;
            if ((int)pgVar26 <= (int)uVar64) {
              pgVar26 = (gen_ctx_t)(ulong)(iVar38 + 2);
            }
          }
          puVar45 = (undefined8 *)puVar45[3];
        } while (puVar45 != (undefined8 *)0x0);
        uVar64 = (uint)pgVar26;
        if (-1 < (int)uVar64) {
          if ((int)uVar64 < (int)uVar48) {
            uVar48 = uVar64;
          }
          uVar30 = (ulong)((int)uVar30 + uVar48 * 2);
        }
      }
      pMVar27 = (MIR_context_t)pMVar27->c2mir_ctx;
    } while (pMVar27 != (MIR_context_t)0x0);
  }
LAB_0016e1e5:
  return (int)uVar30;
LAB_0016e21b:
  pcStack_68 = (code *)0x16e220;
  gap_lr_spill_cost_cold_1();
LAB_0016e220:
  pcStack_68 = (code *)0x16e225;
  gap_lr_spill_cost_cold_2();
  pgVar49 = pgVar58;
LAB_0016e225:
  pcStack_68 = HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  pVVar54 = pgVar26->tied_regs;
  pgStack_d0 = pgVar55;
  pgStack_90 = pgVar49;
  pgStack_88 = unaff_R12;
  pMStack_80 = unaff_R13;
  uStack_78 = uVar30;
  pgStack_70 = unaff_R15;
  pcStack_68 = (code *)uVar53;
  if (pVVar54 == (bitmap_t)0x0) {
    pcStack_f0 = (code *)0x16e5b0;
    HTAB_lr_gap_t_do_cold_8();
    pgVar58 = pgVar26;
    pgVar26 = pgVar61;
    pgVar61 = unaff_R15;
LAB_0016e5b0:
    pcStack_f0 = (code *)0x16e5b5;
    HTAB_lr_gap_t_do_cold_7();
LAB_0016e5b5:
    pcStack_f0 = (code *)0x16e5ba;
    HTAB_lr_gap_t_do_cold_4();
    pgVar66 = unaff_R12;
    pMVar27 = unaff_R13;
    pVVar71 = pVVar54;
LAB_0016e5ba:
    pcStack_f0 = (code *)0x16e5bf;
    HTAB_lr_gap_t_do_cold_3();
    pgVar50 = pgVar49;
LAB_0016e5bf:
    pcStack_f0 = (code *)0x16e5c4;
    HTAB_lr_gap_t_do_cold_5();
LAB_0016e5c4:
    pcStack_f0 = (code *)0x16e5c9;
    HTAB_lr_gap_t_do_cold_6();
    pVVar54 = pVVar71;
LAB_0016e5c9:
    pcStack_f0 = (code *)0x16e5ce;
    HTAB_lr_gap_t_do_cold_1();
  }
  else {
    puVar45 = (undefined8 *)(((anon_union_32_12_57d33f68_for_u *)&pgVar26->addr_insn_p)->str).len;
    pgVar58 = pgVar26;
    if (puVar45 == (undefined8 *)0x0) goto LAB_0016e5b0;
    pgStack_d8 = (gen_ctx *)pgVar26->curr_func_item;
    pgVar49 = (gen_ctx_t)pVVar54->els_num;
    pgVar66 = (gen_ctx_t)((ulong)pbVar40 & 0xffffffff);
    uVar48 = (int)pbVar40 - 1;
    uVar53 = (ulong)uVar48;
    pgStack_e0 = pgVar26;
    pMStack_c8 = extraout_RDX;
    if (1 < uVar48) {
LAB_0016e3d9:
      pcStack_f0 = (code *)0x16e3f0;
      pgVar58 = pgStack_d0;
      iVar38 = (*(code *)pgStack_e0->debug_file)(pgStack_d0,pMStack_c8,pgStack_d8);
      uVar64 = iVar38 + (uint)(iVar38 == 0);
      pgVar55 = (gen_ctx *)(ulong)uVar64;
      pgVar26 = pgStack_e0;
      unaff_R12 = pgVar66;
      if (pgStack_e0->tied_regs == (bitmap_t)0x0) goto LAB_0016e5b5;
      pbVar40 = (bitmap_el_t *)
                (((anon_union_32_12_57d33f68_for_u *)&pgStack_e0->addr_insn_p)->str).len;
      pMVar27 = unaff_R13;
      pVVar71 = pVVar54;
      uStack_b4 = uVar48;
      pgStack_b0 = pgVar61;
      pgStack_a8 = pgVar66;
      if (pbVar40 != (bitmap_el_t *)0x0) {
        pbVar28 = pgStack_e0->tied_regs->varr;
        bVar6 = pbVar40[2];
        uVar53 = (ulong)((int)pgVar49 - 1);
        pMStack_c0 = (MIR_context_t)CONCAT44(pMStack_c0._4_4_,uVar64);
        pgVar33 = pgVar55;
        pgVar61 = pgStack_e0;
        puVar69 = (uint *)0x0;
        uStack_a0 = uVar53;
        pbStack_98 = pbVar28;
        do {
          uVar64 = uVar64 & (uint)uVar53;
          puVar67 = (uint *)((long)pbVar28 + (ulong)uVar64 * 4);
          uVar30 = (ulong)*puVar67;
          puVar70 = puVar67;
          if (uVar30 != 0xfffffffe) {
            if (*puVar67 == 0xffffffff) {
              if (1 < uStack_b4) {
                return 0;
              }
              *(int *)&pgVar61->ctx = *(int *)&pgVar61->ctx + 1;
              uVar53 = (ulong)*(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar61->optimize_level)->prev;
              if (puVar69 != (uint *)0x0) {
                puVar67 = puVar69;
              }
              *(int *)(bVar6 + uVar53 * 0x18) = (int)pgVar33;
              *(gen_ctx **)(bVar6 + 8 + uVar53 * 0x18) = pgStack_d0;
              *(MIR_insn_t *)(bVar6 + 0x10 + uVar53 * 0x18) = pMStack_c8;
              uVar48 = *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar61->optimize_level)->prev;
              *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar61->optimize_level)->prev = uVar48 + 1;
              *puVar67 = uVar48;
              pgStack_b0->ctx = (MIR_context_t)pgStack_d0;
              ((DLIST_LINK_MIR_insn_t *)&pgStack_b0->optimize_level)->prev = pMStack_c8;
              return 0;
            }
            puVar70 = puVar69;
            if (*(int *)(bVar6 + uVar30 * 0x18) == (int)pgVar33) {
              puVar1 = (undefined4 *)(bVar6 + uVar30 * 0x18);
              pcStack_f0 = (code *)0x16e48e;
              iVar38 = (*(code *)((MIR_op_t *)&pgStack_e0->debug_level)->data)
                                 (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),pgStack_d0
                                  ,pMStack_c8,pgStack_d8);
              pgVar26 = pgStack_b0;
              pgVar33 = (gen_ctx *)((ulong)pMStack_c0 & 0xffffffff);
              uVar53 = uStack_a0;
              pbVar28 = pbStack_98;
              pgVar61 = pgStack_e0;
              if (iVar38 != 0) {
                if ((int)pgStack_a8 == 3) {
                  *(int *)&pgStack_e0->ctx = *(int *)&pgStack_e0->ctx + -1;
                  *puVar67 = 0xfffffffe;
                  if (pgStack_e0->to_free != (VARR_void_ptr_t *)0x0) {
                    pcStack_f0 = (code *)0x16e590;
                    (*(code *)pgStack_e0->to_free)
                              (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),pgStack_d8);
                  }
                  *puVar1 = 0;
                }
                else {
                  if ((int)pgStack_a8 == 2) {
                    if (pgStack_e0->to_free != (VARR_void_ptr_t *)0x0) {
                      pcStack_f0 = (code *)0x16e54b;
                      (*(code *)pgStack_e0->to_free)
                                (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),pgStack_d8)
                      ;
                    }
                    *(gen_ctx **)(puVar1 + 2) = pgStack_d0;
                    *(MIR_insn_t *)(puVar1 + 4) = pMStack_c8;
                  }
                  pMVar42 = *(MIR_insn_t *)(puVar1 + 4);
                  pgVar26->ctx = *(MIR_context_t *)(puVar1 + 2);
                  ((DLIST_LINK_MIR_insn_t *)&pgVar26->optimize_level)->prev = pMVar42;
                }
                return 1;
              }
            }
          }
          *(int *)&pgVar61->field_0xc = *(int *)&pgVar61->field_0xc + 1;
          pgVar55 = (gen_ctx *)((ulong)pgVar55 >> 0xb);
          uVar64 = (int)pgVar55 + 1 + uVar64 * 5;
          puVar69 = puVar70;
        } while( true );
      }
      goto LAB_0016e5ba;
    }
    pgVar50 = (gen_ctx_t)*puVar45;
    if (*(int *)&((DLIST_LINK_MIR_insn_t *)&pgVar26->optimize_level)->prev != (int)pgVar50)
    goto LAB_0016e3d9;
    pgVar58 = (gen_ctx_t)pVVar54->varr;
    pgVar55 = pgStack_d8;
    pMVar27 = unaff_R13;
    pVVar71 = pVVar54;
    if (pgVar58 == (gen_ctx_t)0x0) goto LAB_0016e5c4;
    pMVar27 = (MIR_context_t)(ulong)((uint)pgVar49 * 2);
    if ((MIR_context_t)pVVar54->size != pMVar27) {
      pgVar55 = (gen_ctx *)((long)pMVar27 * 4);
      pcStack_f0 = (code *)0x16e2c2;
      pMStack_c0 = pMVar27;
      pbVar28 = (bitmap_el_t *)realloc(pgVar58,(size_t)pgVar55);
      pVVar54->varr = pbVar28;
      pVVar71 = pgStack_e0->tied_regs;
      pVVar54->size = (size_t)pMStack_c0;
      pVVar54->els_num = (size_t)pMStack_c0;
      pgVar26 = pgStack_e0;
      pMVar27 = pMStack_c0;
      pVVar54 = pVVar71;
      if (pVVar71 != (bitmap_t)0x0) goto LAB_0016e2ea;
      goto LAB_0016e5c9;
    }
    pVVar54->els_num = (size_t)pMVar27;
LAB_0016e2ea:
    if ((int)pMVar27 != 0) {
      pgVar58 = (gen_ctx_t)pVVar71->varr;
      pgVar55 = (gen_ctx *)0xff;
      pcStack_f0 = (code *)0x16e307;
      memset(pgVar58,0xff,(ulong)((uint)pgVar49 & 0x7fffffff) << 3);
    }
    pVVar71 = (bitmap_t)(((anon_union_32_12_57d33f68_for_u *)&pgStack_e0->addr_insn_p)->str).len;
    pgVar26 = pgStack_e0;
    if ((pVVar71 == (bitmap_t)0x0) ||
       (pgVar58 = (gen_ctx_t)pVVar71->varr, pgVar58 == (gen_ctx_t)0x0)) goto LAB_0016e5bf;
    pgVar50 = (gen_ctx_t)(ulong)(uint)((int)pgVar50 * 2);
    if ((gen_ctx_t)pVVar71->size == pgVar50) {
      pVVar71->els_num = (size_t)pgVar50;
      pVVar54 = pVVar71;
LAB_0016e368:
      pbVar40 = pVVar54->varr;
      uVar64 = *(uint *)((long)&pgStack_e0->ctx + 4);
      uVar4 = *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgStack_e0->optimize_level)->prev;
      *(undefined4 *)&pgStack_e0->ctx = 0;
      *(undefined4 *)&((DLIST_LINK_MIR_insn_t *)&pgStack_e0->optimize_level)->prev = 0;
      *(undefined4 *)((long)&pgStack_e0->ctx + 4) = 0;
      if (uVar64 < uVar4) {
        iVar38 = uVar4 - uVar64;
        pVVar54 = (bitmap_t)(pbVar40 + (ulong)uVar64 * 3 + 2);
        pgVar26 = pgStack_e0;
        do {
          if ((int)pVVar54[-1].size != 0) {
            pcStack_f0 = (code *)0x16e3ae;
            el.lr = (live_range_t_conflict)pVVar54->els_num;
            el._0_8_ = pVVar54[-1].varr;
            HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar26,el,HTAB_INSERT,(lr_gap_t *)pgVar61);
            pbVar40 = (bitmap_el_t *)pVVar54->els_num;
            pcStack_f0 = (code *)0x16e3c9;
            (*(code *)((MIR_op_t *)&pgStack_e0->debug_level)->data)
                      (pgVar61->ctx,((DLIST_LINK_MIR_insn_t *)&pgVar61->optimize_level)->prev,
                       pVVar54[-1].varr,pbVar40,pgStack_d8);
            pgVar26 = pgStack_e0;
          }
          pVVar54 = pVVar54 + 1;
          iVar38 = iVar38 + -1;
        } while (iVar38 != 0);
      }
      pgVar49 = (gen_ctx_t)((ulong)pMVar27 & 0xffffffff);
      unaff_R13 = pMVar27;
      goto LAB_0016e3d9;
    }
    pgVar55 = (gen_ctx *)((long)pgVar50 * 0x18);
    pcStack_f0 = (code *)0x16e348;
    pbVar28 = (bitmap_el_t *)realloc(pgVar58,(size_t)pgVar55);
    pVVar71->varr = pbVar28;
    pVVar54 = (bitmap_t)(((anon_union_32_12_57d33f68_for_u *)&pgStack_e0->addr_insn_p)->str).len;
    pVVar71->size = (size_t)pgVar50;
    pVVar71->els_num = (size_t)pgVar50;
    pgVar26 = pgStack_e0;
    if (pVVar54 != (bitmap_t)0x0) goto LAB_0016e368;
  }
  pcStack_f0 = rewrite_insn;
  HTAB_lr_gap_t_do_cold_2();
  pMVar60 = pgVar58->ctx;
  paStack_2c8 = (anon_union_32_12_57d33f68_for_u *)0x0;
  pcStack_398 = (code *)0x16e61a;
  pgStack_118 = pgVar50;
  pgStack_110 = pgVar66;
  pMStack_108 = pMVar27;
  pVStack_100 = pVVar54;
  pgStack_f8 = pgVar61;
  pcStack_f0 = (code *)uVar53;
  MIR_new_int_op(pMVar60,0);
  pcStack_398 = (code *)0x16e62c;
  MIR_new_int_op(pMVar60,0);
  pcStack_398 = (code *)0x16e637;
  sStack_2b0 = MIR_insn_nops(pMVar60,(MIR_insn_t_conflict)pgVar55);
  pMStack_2c0 = (MIR_op_t *)&pgVar55->debug_level;
  pMStack_2b8 = (MIR_insn_t_conflict)((long)&pgVar55->addr_regs + 4);
  uVar53 = CONCAT71((int7)((ulong)pgVar66 >> 8),1);
  uStack_2d4 = 0xffffffff;
  uStack_2d0 = 0xffffffff;
  do {
    if (sStack_2b0 != 0) {
      sVar72 = 0;
      pMVar31 = pMStack_2b8;
      do {
        pcStack_398 = (code *)0x16e6b0;
        MVar21 = MIR_insn_op_mode(pMVar60,(MIR_insn_t_conflict)pgVar55,sVar72,&iStack_2cc);
        iVar38 = iStack_2cc;
        if ((byte)uVar53 != 0) {
          if ((iStack_2cc != 0) &&
             (cVar37 = *(char *)((long)&pMVar31[-1].ops[0].u + 4), cVar37 != '\v'))
          goto LAB_0016e6e9;
          goto LAB_0016eae5;
        }
        cVar37 = *(char *)((long)&pMVar31[-1].ops[0].u + 4);
        if (iStack_2cc == 0) {
          iVar38 = 0;
        }
        else if (cVar37 != '\v') goto LAB_0016eae5;
LAB_0016e6e9:
        if (cVar37 != '\v') {
          if (cVar37 != '\x02') goto LAB_0016eae5;
          uVar48 = pMVar31[-1].ops[0].u.mem.nloc;
          uVar30 = (ulong)uVar48;
          if (uVar30 < 0x22) {
            pVVar54 = pgVar58->func_used_hard_regs;
            pcStack_398 = (code *)0x16e725;
            bitmap_expand(pVVar54,uVar30 + 1);
            if (pVVar54 != (bitmap_t)0x0) {
              *pVVar54->varr = *pVVar54->varr | 1L << (uVar30 & 0x3f);
              if (pbVar40 != (bitmap_el_t *)0x0) {
                pcStack_398 = (code *)0x16e757;
                update_live(pMVar31[-1].ops[0].u.mem.nloc,iStack_2cc,(bitmap_t)pbVar40[1]);
              }
              goto LAB_0016eae5;
            }
LAB_0016fce6:
            pcStack_398 = (code *)0x16fceb;
            rewrite_insn_cold_9();
            goto LAB_0016fceb;
          }
          if (iVar38 == 0) {
            pVVar10 = pgVar58->ra_ctx->reg_renumber;
            if (((pVVar10 != (VARR_MIR_reg_t *)0x0) && (pVVar10->varr != (MIR_reg_t *)0x0)) &&
               (uVar30 < pVVar10->els_num)) {
              paStack_2c8 = (anon_union_32_12_57d33f68_for_u *)
                            (ulong)((int)paStack_2c8 +
                                   (uint)(MVar21 - MIR_OP_REF < 0xfffffffd &&
                                         0x21 < pVVar10->varr[uVar30]));
              goto LAB_0016e909;
            }
LAB_0016fce1:
            pcStack_398 = (code *)0x16fce6;
            rewrite_insn_cold_8();
            goto LAB_0016fce6;
          }
LAB_0016e909:
          if (pbVar40 == (bitmap_el_t *)0x0) goto LAB_0016eae5;
          pcStack_398 = (code *)0x16e91a;
          update_live(uVar48,iVar38,(bitmap_t)pbVar40[1]);
          plVar5 = (long *)pbVar40[2];
          if (plVar5 != (long *)0x0) {
            uVar48 = pMVar31[-1].ops[0].u.mem.nloc;
            uVar30 = (ulong)uVar48;
            if (((ulong)(*plVar5 << 6) <= uVar30) ||
               (uVar41 = (ulong)(uVar48 >> 6), uVar59 = *(ulong *)(plVar5[2] + uVar41 * 8),
               *(ulong *)(plVar5[2] + uVar41 * 8) = uVar59 & ~(1L << (uVar30 & 0x3f)),
               (uVar59 >> (uVar30 & 0x3f) & 1) == 0)) goto LAB_0016eae5;
            MVar23 = pMVar31[-1].ops[0].u.mem.nloc;
LAB_0016eac5:
            pgVar26 = (gen_ctx_t)&DAT_00000001;
            puVar63 = (undefined8 *)0x0;
            pcStack_398 = (code *)0x16eae5;
            spill_restore_reg(pgVar58,MVar23,base_reg,(MIR_insn_t)pgVar55,1,0);
            goto LAB_0016eae5;
          }
LAB_0016fcf5:
          pcStack_398 = (code *)0x16fcfa;
          rewrite_insn_cold_7();
LAB_0016fcfa:
          pcStack_398 = (code *)0x16fcff;
          rewrite_insn_cold_4();
LAB_0016fcff:
          pcStack_398 = (code *)0x16fd04;
          rewrite_insn_cold_2();
LAB_0016fd04:
          pcStack_398 = (code *)0x16fd09;
          rewrite_insn_cold_1();
          goto LAB_0016fd09;
        }
        uVar30 = (ulong)*(uint *)((long)&pMVar31[-1].ops[0].u + 0x1c);
        if (uVar30 < 0x22) {
          pVVar54 = pgVar58->func_used_hard_regs;
          pcStack_398 = (code *)0x16e788;
          bitmap_expand(pVVar54,uVar30 + 1);
          if (pVVar54 != (bitmap_t)0x0) {
            *pVVar54->varr = *pVVar54->varr | 1L << (uVar30 & 0x3f);
            goto LAB_0016e7aa;
          }
LAB_0016fceb:
          pcStack_398 = (code *)0x16fcf0;
          rewrite_insn_cold_6();
LAB_0016fcf0:
          pcStack_398 = (code *)0x16fcf5;
          rewrite_insn_cold_5();
          goto LAB_0016fcf5;
        }
LAB_0016e7aa:
        uVar30 = (ulong)*(uint *)&pMVar31->data;
        if (uVar30 < 0x22) {
          pVVar54 = pgVar58->func_used_hard_regs;
          pcStack_398 = (code *)0x16e7cd;
          bitmap_expand(pVVar54,uVar30 + 1);
          if (pVVar54 != (bitmap_t)0x0) {
            *pVVar54->varr = *pVVar54->varr | 1L << (uVar30 & 0x3f);
            goto LAB_0016e7ef;
          }
          goto LAB_0016fcf0;
        }
LAB_0016e7ef:
        uVar48 = *(uint *)((long)&pMVar31[-1].ops[0].u + 0x1c);
        uVar30 = (ulong)uVar48;
        if (uVar30 == 0xffffffff) {
          if (pbVar40 != (bitmap_el_t *)0x0) goto LAB_0016ea72;
          goto LAB_0016eae5;
        }
        uVar64 = *(uint *)&pMVar31->data;
        if (0xffffffdc < uVar64 - 0x22 || uVar48 < 0x22) goto LAB_0016e9fb;
        pVVar10 = pgVar58->ra_ctx->reg_renumber;
        if (((pVVar10 == (VARR_MIR_reg_t *)0x0) ||
            (pMVar7 = pVVar10->varr, pMVar7 == (MIR_reg_t *)0x0)) || (pVVar10->els_num <= uVar30)) {
          pcStack_398 = (code *)0x16fce1;
          rewrite_insn_cold_3();
          goto LAB_0016fce1;
        }
        if (0x21 < pMVar7[uVar30]) {
          if (pVVar10->els_num <= (ulong)uVar64) goto LAB_0016fd04;
          if (pMVar7[uVar64] < 0x22) goto LAB_0016e9fb;
          if (iStack_2cc == 0) {
            bVar73 = -1 < (int)uStack_2d4;
            uStack_2d4 = (uint)sVar72;
            uVar4 = uStack_2d0;
            if (bVar73) goto LAB_0016fd66;
          }
          else {
            bVar73 = -1 < (int)uStack_2d0;
            uStack_2d0 = (uint)sVar72;
            uVar4 = uStack_2d4;
            if (bVar73) goto LAB_0016fd42;
          }
          if ((((int)uVar4 < 0) || (uVar48 != pMStack_2c0[uVar4].u.mem.base)) ||
             (uVar64 != pMStack_2c0[uVar4].u.mem.index)) {
            paStack_2c8 = (anon_union_32_12_57d33f68_for_u *)(ulong)((int)paStack_2c8 + 2);
          }
        }
LAB_0016e9fb:
        if (pbVar40 == (bitmap_el_t *)0x0) goto LAB_0016eae5;
        pcStack_398 = (code *)0x16ea0f;
        update_live(uVar48,0,(bitmap_t)pbVar40[1]);
        uVar48 = *(uint *)((long)&pMVar31[-1].ops[0].u + 0x1c);
        uVar30 = (ulong)uVar48;
        if (0x21 < uVar30) {
          plVar5 = (long *)pbVar40[2];
          if (plVar5 != (long *)0x0) {
            if ((uVar30 < (ulong)(*plVar5 << 6)) &&
               (uVar41 = (ulong)(uVar48 >> 6), uVar59 = *(ulong *)(plVar5[2] + uVar41 * 8),
               *(ulong *)(plVar5[2] + uVar41 * 8) = uVar59 & ~(1L << (uVar30 & 0x3f)),
               (uVar59 >> (uVar30 & 0x3f) & 1) != 0)) {
              pgVar26 = (gen_ctx_t)&DAT_00000001;
              puVar63 = (undefined8 *)0x0;
              pcStack_398 = (code *)0x16ea72;
              spill_restore_reg(pgVar58,*(MIR_reg_t *)((long)&pMVar31[-1].ops[0].u + 0x1c),base_reg,
                                (MIR_insn_t)pgVar55,1,0);
            }
            goto LAB_0016ea72;
          }
          goto LAB_0016fcff;
        }
LAB_0016ea72:
        if (*(MIR_reg_t *)&pMVar31->data != 0xffffffff) {
          pcStack_398 = (code *)0x16ea84;
          update_live(*(MIR_reg_t *)&pMVar31->data,0,(bitmap_t)pbVar40[1]);
          uVar30 = (ulong)*(uint *)&pMVar31->data;
          if (uVar30 < 0x22) goto LAB_0016eae5;
          plVar5 = (long *)pbVar40[2];
          if (plVar5 != (long *)0x0) {
            if ((uVar30 < (ulong)(*plVar5 << 6)) &&
               (uVar41 = (ulong)(*(uint *)&pMVar31->data >> 6),
               uVar59 = *(ulong *)(plVar5[2] + uVar41 * 8),
               *(ulong *)(plVar5[2] + uVar41 * 8) = uVar59 & ~(1L << (uVar30 & 0x3f)),
               (uVar59 >> (uVar30 & 0x3f) & 1) != 0)) {
              MVar23 = *(MIR_reg_t *)&pMVar31->data;
              goto LAB_0016eac5;
            }
            goto LAB_0016eae5;
          }
          goto LAB_0016fcfa;
        }
LAB_0016eae5:
        sVar72 = sVar72 + 1;
        pMVar31 = (MIR_insn_t_conflict)&pMVar31->ops[0].u;
      } while (sStack_2b0 != sVar72);
    }
    if ((~(byte)uVar53 & 1) == 0 && pbVar40 != (bitmap_el_t *)0x0) {
      pcStack_398 = (code *)0x16eb29;
      target_get_early_clobbered_hard_regs
                ((MIR_insn_t)pgVar55->debug_file,(MIR_reg_t *)&MStack_240,(MIR_reg_t *)&MStack_270);
      if ((MIR_reg_t)MStack_240.data != 0xffffffff) {
        pcStack_398 = (code *)0x16eb43;
        update_live((MIR_reg_t)MStack_240.data,1,(bitmap_t)pbVar40[1]);
      }
      if ((MIR_reg_t)MStack_270.data != 0xffffffff) {
        pcStack_398 = (code *)0x16eb5d;
        update_live((MIR_reg_t)MStack_270.data,1,(bitmap_t)pbVar40[1]);
      }
      if (0xfffffffc < *(int *)&pgVar55->debug_file - 0xaaU) {
        pVVar54 = pgVar58->call_used_hard_regs[0x12];
        if (pVVar54 == (bitmap_t)0x0) goto LAB_0016fd3d;
        pgVar33 = (gen_ctx *)pgVar55->ctx;
        uVar30 = pVVar54->els_num;
        if (uVar30 != 0) {
          uVar41 = 0;
          uVar59 = 0;
          do {
            while ((pVVar54->varr[uVar41] == 0 ||
                   (uVar56 = pVVar54->varr[uVar41] >> (uVar59 & 0x3f), uVar56 == 0))) {
              uVar41 = uVar41 + 1;
              uVar59 = uVar41 * 0x40;
              if (uVar30 == uVar41) goto LAB_0016ebfd;
            }
            uVar30 = uVar56 & 1;
            uVar41 = uVar59;
            while (uVar30 == 0) {
              uVar41 = uVar41 + 1;
              uVar30 = uVar56 & 2;
              uVar56 = uVar56 >> 1;
            }
            uVar59 = uVar41 + 1;
            pcStack_398 = (code *)0x16ebee;
            update_live((MIR_reg_t)uVar41,1,(bitmap_t)pbVar40[1]);
            uVar30 = pVVar54->els_num;
            uVar41 = uVar59 >> 6;
          } while (uVar41 < uVar30);
        }
LAB_0016ebfd:
        pVVar54 = pgVar33->insn_to_consider;
        if (pVVar54 != (bitmap_t)0x0) {
          uVar30 = pVVar54->els_num;
          if (uVar30 != 0) {
            uVar41 = 0;
            uVar59 = 0;
            do {
              while ((pVVar54->varr[uVar41] == 0 ||
                     (uVar56 = pVVar54->varr[uVar41] >> (uVar59 & 0x3f), uVar56 == 0))) {
                uVar41 = uVar41 + 1;
                uVar59 = uVar41 * 0x40;
                if (uVar30 == uVar41) goto LAB_0016ec80;
              }
              uVar30 = uVar56 & 1;
              uVar41 = uVar59;
              while (uVar30 == 0) {
                uVar41 = uVar41 + 1;
                uVar30 = uVar56 & 2;
                uVar56 = uVar56 >> 1;
              }
              uVar59 = uVar41 + 1;
              pcStack_398 = (code *)0x16ec71;
              update_live((MIR_reg_t)uVar41,0,(bitmap_t)pbVar40[1]);
              uVar30 = pVVar54->els_num;
              uVar41 = uVar59 >> 6;
            } while (uVar41 < uVar30);
          }
LAB_0016ec80:
          puVar8 = (ulong *)pbVar40[1];
          if (puVar8 != (ulong *)0x0) {
            uVar30 = *puVar8;
            if (uVar30 != 0) {
              uVar41 = 0;
              uVar59 = 0;
              do {
                while ((uVar56 = *(ulong *)(puVar8[2] + uVar41 * 8), uVar56 == 0 ||
                       (uVar56 = uVar56 >> (uVar59 & 0x3f), uVar56 == 0))) {
                  uVar41 = uVar41 + 1;
                  uVar59 = uVar41 * 0x40;
                  if (uVar30 == uVar41) goto LAB_0016ee44;
                }
                uVar30 = uVar56 & 1;
                while (uVar30 == 0) {
                  uVar59 = uVar59 + 1;
                  uVar30 = uVar56 & 2;
                  uVar56 = uVar56 >> 1;
                }
                if (uVar59 < 0x22) goto LAB_0016ee26;
                plVar5 = *(long **)(*pbVar40 + 0x78);
                if (plVar5 == (long *)0x0) {
                  pcStack_398 = (code *)0x16fdc8;
                  rewrite_insn_cold_13();
                  goto LAB_0016fdc8;
                }
                uVar30 = uVar59 & 0xffffffff;
                uVar48 = (uint)uVar59;
                if (((ulong)(*plVar5 << 6) <= uVar30) ||
                   ((*(ulong *)(plVar5[2] + (uVar30 >> 6) * 8) >> (uVar59 & 0x3f) & 1) == 0)) {
                  pVVar10 = pgVar58->ra_ctx->reg_renumber;
                  if ((pVVar10 == (VARR_MIR_reg_t *)0x0) ||
                     ((pVVar10->varr == (MIR_reg_t *)0x0 || (pVVar10->els_num <= uVar30)))) {
                    pcStack_398 = (code *)0x16fd66;
                    rewrite_insn_cold_12();
LAB_0016fd66:
                    pcStack_398 = (code *)0x16fd85;
                    __assert_fail("in_mem_op_num < 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x1f5f,
                                  "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                 );
                  }
                  pMVar42 = (MIR_insn_t)(ulong)pVVar10->varr[uVar30];
                  if (pMVar42 < (MIR_insn_t)0x22) {
                    pcStack_398 = (code *)0x16ed85;
                    pMStack_2a8 = pMVar42;
                    MIR_reg_type(pgVar58->ctx,uVar48 - 0x21,(pgVar58->curr_func_item->u).func);
                    pVVar54 = pgVar58->call_used_hard_regs[0x12];
                    if (pVVar54 == (bitmap_t)0x0) {
                      pcStack_398 = (code *)0x16fdfe;
                      rewrite_insn_cold_11();
                      goto LAB_0016fdfe;
                    }
                    pMVar42 = (MIR_insn_t)(pVVar54->els_num << 6);
                    if ((pMStack_2a8 < pMVar42) &&
                       ((*pVVar54->varr >> ((ulong)pMStack_2a8 & 0x3f) & 1) != 0)) {
                      pgVar61 = (gen_ctx_t)pbVar40[2];
                      sVar72 = uVar30 + 1;
                      pcStack_398 = (code *)0x16edce;
                      pgVar49 = pgVar61;
                      bitmap_expand((bitmap_t)pgVar61,sVar72);
                      iVar38 = (int)pgVar26;
                      iVar24 = (int)puVar63;
                      if (pgVar61 == (gen_ctx_t)0x0) {
                        pcStack_398 = spill_restore_reg;
                        rewrite_insn_cold_10();
                        pMVar27 = pgVar49->ctx;
                        MVar23 = (int)sVar72 - 0x21;
                        puStack_3c0 = puVar8;
                        uStack_3b8 = uVar53;
                        pbStack_3b0 = pbVar40;
                        uStack_3a8 = uVar59;
                        pgStack_3a0 = pgVar61;
                        pcStack_398 = (code *)uVar30;
                        MVar22 = MIR_reg_type(pMVar27,MVar23,(pgVar49->curr_func_item->u).func);
                        if (MVar22 == MIR_T_F) {
                          MVar21 = MIR_OP_FLOAT;
                        }
                        else if (MVar22 == MIR_T_D) {
                          MVar21 = MIR_OP_DOUBLE;
                        }
                        else {
                          MVar21 = (uint)(MVar22 == MIR_T_LD) * 4 + MIR_OP_INT;
                        }
                        prVar29 = pgVar49->ra_ctx;
                        pVVar10 = prVar29->reg_renumber;
                        if (((pVVar10 == (VARR_MIR_reg_t *)0x0) ||
                            (pVVar10->varr == (MIR_reg_t *)0x0)) ||
                           (uVar53 = sVar72 & 0xffffffff, pVVar10->els_num <= uVar53))
                        goto LAB_0017022a;
                        uVar48 = pVVar10->varr[uVar53];
                        if (0x21 < uVar48) goto LAB_00170258;
                        pVVar57 = prVar29->used_locs;
                        if (pVVar57 == (VARR_bitmap_t *)0x0) {
                          spill_restore_reg_cold_6();
LAB_0017027c:
                          spill_restore_reg_cold_5();
                        }
                        else {
                          pVVar11 = prVar29->spill_cache;
                          if (pVVar11 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017027c;
                          if (((int)sVar72 == -1) || (pVVar11->els_num <= uVar53))
                          goto LAB_0017022f;
                          psVar12 = pVVar11->varr;
                          if (psVar12[uVar53].age == prVar29->spill_cache_age) {
                            MStack_440 = psVar12[uVar53].slot;
                            goto LAB_0017019a;
                          }
                          pVVar54 = prVar29->conflict_locs1;
                          if ((pVVar54 != (bitmap_t)0x0) && (pVVar54->varr != (bitmap_el_t *)0x0)) {
                            ppVVar13 = pVVar57->varr;
                            pMVar27 = pgVar49->ctx;
                            pVVar54->els_num = 0;
                            pVVar14 = pgVar49->lr_ctx->var_live_ranges;
                            if ((pVVar14 == (VARR_live_range_t *)0x0) ||
                               ((pVVar14->varr == (live_range_t_conflict *)0x0 ||
                                (pVVar14->els_num <= uVar53)))) {
                              spill_restore_reg_cold_3();
                            }
                            else {
                              for (plVar35 = pVVar14->varr[uVar53];
                                  plVar35 != (live_range_t_conflict)0x0; plVar35 = plVar35->next) {
                                if (plVar35->start <= plVar35->finish) {
                                  lVar43 = (long)plVar35->start + -1;
                                  do {
                                    bitmap_ior(pVVar54,pVVar54,ppVVar13[lVar43 + 1]);
                                    lVar43 = lVar43 + 1;
                                  } while (lVar43 < plVar35->finish);
                                }
                              }
                              MVar22 = MIR_reg_type(pMVar27,MVar23,(pgVar49->curr_func_item->u).func
                                                   );
                              MStack_440 = get_stack_loc(pgVar49,pgVar49->ra_ctx->start_mem_loc,
                                                         MVar22,pVVar54,(int *)&MStack_3f8);
                              psVar12[uVar53].slot = MStack_440;
                              psVar12[uVar53].age = pgVar49->ra_ctx->spill_cache_age;
                              pVVar14 = pgVar49->lr_ctx->var_live_ranges;
                              if (((pVVar14 != (VARR_live_range_t *)0x0) &&
                                  (pVVar14->varr != (live_range_t_conflict *)0x0)) &&
                                 (uVar53 < pVVar14->els_num)) {
                                plVar35 = pVVar14->varr[uVar53];
                                if (plVar35 != (live_range_t_conflict)0x0) {
                                  do {
                                    iVar25 = plVar35->finish;
                                    lVar43 = (long)plVar35->start;
                                    if (plVar35->start <= iVar25) {
                                      do {
                                        uVar53 = (ulong)(uint)MStack_3f8.data;
                                        MVar23 = MStack_440;
                                        if (0 < (int)(uint)MStack_3f8.data) {
                                          do {
                                            pVVar54 = ppVVar13[lVar43];
                                            bitmap_expand(pVVar54,(ulong)MVar23 + 1);
                                            if (pVVar54 == (bitmap_t)0x0) {
                                              spill_restore_reg_cold_1();
                                              goto LAB_0017022a;
                                            }
                                            pVVar54->varr[MVar23 >> 6] =
                                                 pVVar54->varr[MVar23 >> 6] |
                                                 1L << ((ulong)MVar23 & 0x3f);
                                            MVar23 = MVar23 + 1;
                                            uVar53 = uVar53 - 1;
                                          } while (uVar53 != 0);
                                          iVar25 = plVar35->finish;
                                        }
                                        bVar73 = lVar43 < iVar25;
                                        lVar43 = lVar43 + 1;
                                      } while (bVar73);
                                    }
                                    plVar35 = plVar35->next;
                                  } while (plVar35 != (live_range_t)0x0);
                                }
LAB_0017019a:
                                if (((FILE *)pgVar49->debug_file != (FILE *)0x0) &&
                                   (1 < pgVar49->debug_level)) {
                                  pcVar47 = "Restore";
                                  if (iVar24 == 0) {
                                    pcVar47 = "Spill";
                                  }
                                  fprintf((FILE *)pgVar49->debug_file,"    %s r%d:",pcVar47,sVar72);
                                }
                                MVar23 = add_ld_st(pgVar49,&MStack_3f8,MStack_440,base_reg_00,MVar21
                                                   ,uVar48,(uint)(iVar24 == 0),10,pMVar42,iVar38);
                                return MVar23;
                              }
                            }
                            spill_restore_reg_cold_2();
LAB_00170258:
                            __assert_fail("hard_reg <= ST1_HARD_REG",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1eb0,
                                          "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)"
                                         );
                          }
                        }
                        iVar24 = (int)pVVar57;
                        iVar38 = (int)sVar72;
                        spill_restore_reg_cold_4();
                        p_Var52 = (MIR_error_func_t)((ulong)pMVar27 & 0xffffffff);
                        if (iVar24 == 0) {
                          nb = p_Var52 + 1;
                          pMVar60 = bm;
                          bitmap_expand((bitmap_t)bm,(size_t)nb);
                          iVar24 = (int)nb;
                          if (bm != (MIR_context_t)0x0) {
                            p_Var36 = bm->error_func;
                            *(ulong *)(p_Var36 + ((ulong)p_Var52 >> 6) * 8) =
                                 *(ulong *)(p_Var36 + ((ulong)p_Var52 >> 6) * 8) |
                                 1L << ((ulong)pMVar27 & 0x3f);
                            goto LAB_001702e7;
                          }
                        }
                        else {
                          if (bm != (MIR_context_t)0x0) {
                            p_Var36 = (MIR_error_func_t)((long)bm->gen_ctx << 6);
                            if (p_Var52 < p_Var36) {
                              p_Var36 = bm->error_func;
                              bVar3 = (byte)p_Var52 & 0x3f;
                              *(ulong *)(p_Var36 + ((ulong)p_Var52 >> 6) * 8) =
                                   *(ulong *)(p_Var36 + ((ulong)p_Var52 >> 6) * 8) &
                                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                            }
LAB_001702e7:
                            return (int)p_Var36;
                          }
                          update_live_cold_1();
                          pMVar60 = pMVar27;
                        }
                        update_live_cold_2();
                        pvVar9 = pMVar60[1].environment_module.data;
                        lVar43 = 0x1e8;
                        uVar53 = (ulong)(iVar38 != 0);
                        if (iVar38 == 0) {
                          lVar43 = 0x188;
                        }
                        iVar38 = *(int *)((long)pvVar9 + uVar53 * 4 + 0x180);
                        lVar62 = (long)iVar38;
                        if (lVar62 < 1) {
                          uVar64 = 0;
                          goto LAB_001703e4;
                        }
                        uVar48 = extraout_EDX - 8;
                        lVar65 = 0;
                        uVar64 = 0;
                        goto LAB_00170360;
                      }
                      pvVar9 = (&pgVar61->curr_func_item->data)[uVar48 >> 6];
                      (&pgVar61->curr_func_item->data)[uVar48 >> 6] =
                           (void *)((ulong)pvVar9 | 1L << (uVar59 & 0x3f));
                      if (((ulong)pvVar9 >> (uVar59 & 0x3f) & 1) == 0) {
                        pgVar26 = (gen_ctx_t)&DAT_00000001;
                        puVar63 = (undefined8 *)&DAT_00000001;
                        pcStack_398 = (code *)0x16ee26;
                        spill_restore_reg(pgVar58,uVar48,base_reg,(MIR_insn_t)pgVar55,1,1);
                      }
                    }
                  }
                }
LAB_0016ee26:
                uVar30 = *puVar8;
                uVar59 = uVar59 + 1;
                uVar41 = uVar59 >> 6;
              } while (uVar41 < uVar30);
            }
            goto LAB_0016ee44;
          }
          pcStack_398 = (code *)0x16fd38;
          rewrite_insn_cold_14();
        }
        pcStack_398 = (code *)0x16fd3d;
        rewrite_insn_cold_15();
LAB_0016fd3d:
        pcStack_398 = (code *)0x16fd42;
        rewrite_insn_cold_16();
LAB_0016fd42:
        pcStack_398 = (code *)0x16fd61;
        __assert_fail("out_mem_op_num < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f5b,
                      "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)");
      }
    }
LAB_0016ee44:
    uVar30 = uVar53 & 1;
    uVar53 = 0;
  } while (uVar30 != 0);
  prVar29 = pgVar58->ra_ctx;
  prVar29->in_reloads_num = 0;
  prVar29->out_reloads_num = 0;
  if ((int)(MIR_reg_t)paStack_2c8 < 3) {
LAB_0016f25c:
    pFVar51 = pgVar55->debug_file;
    if (0xfffffffb < (int)pFVar51 - 0x22U) {
      if (*(char *)&pgVar55->temp_bitmap2 != '\x02') {
        pcStack_398 = (code *)0x16fe3c;
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar48 = *(uint *)&((DLIST_MIR_item_t *)&pgVar55->temp_bitmap3)->head;
      if (0xffffffdc < uVar48 - 0x22) {
        pcStack_398 = (code *)0x16fe5b;
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar10 = pgVar58->ra_ctx->reg_renumber;
      if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
         (pVVar10->els_num <= (ulong)uVar48)) goto LAB_0016fdd2;
      uVar64 = pVVar10->varr[uVar48];
      pMVar27 = pgVar58->ctx;
      pcStack_398 = (code *)0x16f2c9;
      MVar22 = MIR_reg_type(pMVar27,uVar48 - 0x21,(pgVar58->curr_func_item->u).func);
      if (uVar64 < 0x22) {
        pcStack_398 = (code *)0x16fe7a;
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar64 = uVar64 - 0x22;
      if (pgVar58->target_ctx->keep_fp_p == '\0') {
        lVar43 = (ulong)uVar64 << 3;
      }
      else {
        lVar43 = -0xb0;
        if (((pgVar58->curr_func_item->u).func)->vararg_p == '\0') {
          lVar43 = 0;
        }
        lVar43 = lVar43 + (ulong)((MVar22 == MIR_T_LD) + 1 + uVar64) * -8;
      }
      pcStack_398 = (code *)0x16f32b;
      MVar23 = get_reload_hreg(pgVar58,0xffffffff,6,0);
      pcStack_398 = (code *)0x16f345;
      _MIR_new_var_op(pMVar27,MVar23);
      pcStack_398 = (code *)0x16f350;
      iVar32 = _MIR_addr_offset(pMVar27,*(MIR_insn_code_t *)&pgVar55->debug_file);
      pcStack_398 = (code *)0x16f369;
      MIR_new_int_op(pMVar27,lVar43 + iVar32);
      pcStack_398 = (code *)0x16f3a5;
      pMStack_2b8 = MIR_new_insn(pMVar27,MIR_MOV);
      pcStack_398 = (code *)0x16f3c2;
      _MIR_new_var_op(pMVar27,MVar23);
      paStack_2c8 = (anon_union_32_12_57d33f68_for_u *)CONCAT44(paStack_2c8._4_4_,MVar23);
      pcStack_398 = (code *)0x16f3de;
      _MIR_new_var_op(pMVar27,MVar23);
      pcStack_398 = (code *)0x16f3f8;
      _MIR_new_var_op(pMVar27,base_reg);
      pMVar31 = pMStack_2b8;
      pcStack_398 = (code *)0x16f45e;
      insn = MIR_new_insn(pMVar27,MIR_ADD);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        if (pgVar58->optimize_level == 0) {
          uVar48 = *(int *)&pgVar55->debug_file - 0xa7;
          pgVar33 = pgVar55;
          if ((uVar48 < 0xe) && ((0x2007U >> (uVar48 & 0x1f) & 1) != 0)) {
            pgVar33 = (gen_ctx *)pgVar55->ctx;
          }
        }
        else {
          pgVar33 = (gen_ctx *)&((gen_ctx *)pgVar55->ctx)->addr_insn_p;
        }
        pcStack_398 = (code *)0x16f4c2;
        fprintf((FILE *)pgVar58->debug_file,"    Adding before insn (in BB %lu) ",
                ((gen_ctx *)pgVar33->ctx)->ctx);
        pcStack_398 = (code *)0x16f4e6;
        MIR_output_insn(pMVar27,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                        (pgVar58->curr_func_item->u).func,0);
        pcStack_398 = (code *)0x16f501;
        fwrite(":\n      ",8,1,(FILE *)pgVar58->debug_file);
        pcStack_398 = (code *)0x16f520;
        MIR_output_insn(pMVar27,pgVar58->debug_file,pMVar31,(pgVar58->curr_func_item->u).func,1);
        pcStack_398 = (code *)0x16f53b;
        fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
        pcStack_398 = (code *)0x16f55a;
        MIR_output_insn(pMVar27,pgVar58->debug_file,insn,(pgVar58->curr_func_item->u).func,1);
      }
      pcStack_398 = (code *)0x16f56c;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,pMVar31);
      pcStack_398 = (code *)0x16f57a;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,insn);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_398 = (code *)0x16f5a4;
        fwrite("Changing ",9,1,(FILE *)pgVar58->debug_file);
        pcStack_398 = (code *)0x16f5be;
        MIR_output_insn(pMVar27,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                        (pgVar58->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar55->debug_file = 0;
      pcStack_398 = (code *)0x16f5df;
      _MIR_new_var_op(pMVar27,(MIR_reg_t)paStack_2c8);
      pgVar55->temp_bitmap3 = (bitmap_t)auStack_170._0_8_;
      pgVar55->call_used_hard_regs[0] = (bitmap_t)auStack_170._8_8_;
      pgVar55->call_used_hard_regs[1] = (bitmap_t)auStack_160._0_8_;
      pgVar55->call_used_hard_regs[2] = (bitmap_t)auStack_160._8_8_;
      pgVar55->temp_bitmap = (bitmap_t)auStack_180._0_8_;
      pgVar55->temp_bitmap2 = (bitmap_t)auStack_180._8_8_;
      pgVar55->temp_bitmap3 = (bitmap_t)auStack_170._0_8_;
      pgVar55->call_used_hard_regs[0] = (bitmap_t)auStack_170._8_8_;
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_398 = (code *)0x16f61c;
        fwrite(" to ",4,1,(FILE *)pgVar58->debug_file);
        pcStack_398 = (code *)0x16f639;
        MIR_output_insn(pMVar27,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                        (pgVar58->curr_func_item->u).func,1);
      }
      pFVar51 = pgVar55->debug_file;
    }
    if (sStack_2b0 != 0) {
      paStack_2c8 = (anon_union_32_12_57d33f68_for_u *)&pgVar55->addr_insn_p;
      pMVar31 = (MIR_insn_t_conflict)(ulong)((int)pFVar51 - 0xaa);
      sVar72 = 0;
      pMStack_2b8 = pMVar31;
      do {
        pMVar68 = pMStack_2c0 + sVar72;
        pcStack_398 = (code *)0x16f69f;
        MVar21 = MIR_insn_op_mode(pMVar60,(MIR_insn_t_conflict)pgVar55,sVar72,&iStack_2cc);
        if ((pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          auVar2 = *(undefined1 (*) [32])pMVar68;
          pauVar34 = (undefined1 (*) [32])apvStack_210;
          if (iStack_2cc == 0) {
            pauVar34 = (undefined1 (*) [32])&pVStack_1e0;
          }
          *(anon_union_32_12_57d33f68_for_u *)(*pauVar34 + 0x10) = pMVar68->u;
          *pauVar34 = auVar2;
        }
        if (pMVar68->field_0x8 == '\v') {
          if (((uint)pMVar31 < 0xfffffffd) || (*(byte *)&pMVar68->u - 0x11 < 0xfffffffb)) {
            MVar23 = *(MIR_reg_t *)((long)&pMVar68->u + 0x10);
            if (0x22 < MVar23 + 1) {
              pcStack_398 = (code *)0x16f7dc;
              MVar23 = change_reg(pgVar58,&MStack_2a0,MVar23,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar55
                                  ,0);
              *(MIR_reg_t *)((long)&pMVar68->u + 0x10) = MVar23;
              if (MVar23 == 0xffffffff) {
                pcStack_398 = (code *)0x16fda4;
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar23 = (pMVar68->u).mem.index;
            if (0x22 < MVar23 + 1) {
              pcStack_398 = (code *)0x16f82f;
              MVar23 = change_reg(pgVar58,&MStack_2a0,MVar23,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar55
                                  ,0);
              (pMVar68->u).mem.index = MVar23;
              if (MVar23 == 0xffffffff) {
                pcStack_398 = (code *)0x16fdc3;
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((pMVar68->field_0x8 == '\x02') && (0x21 < (pMVar68->u).reg)) {
          if (MVar21 == MIR_OP_VAR) {
            if ((*(int *)&pgVar55->debug_file != 0xb9) &&
               ((sVar72 != 1 || (3 < *(int *)&pgVar55->debug_file - 0x1eU)))) goto LAB_0016fdd7;
            pcStack_398 = (code *)0x16f767;
            MVar22 = MIR_reg_type(pMVar60,(pMVar68->u).reg - 0x21,(pgVar58->curr_func_item->u).func)
            ;
            if (MVar22 == MIR_T_F) {
              MVar21 = MIR_OP_FLOAT;
            }
            else if (MVar22 == MIR_T_D) {
              MVar21 = MIR_OP_DOUBLE;
            }
            else {
              MVar21 = (uint)(MVar22 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar10 = pgVar58->ra_ctx->reg_renumber;
          if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
             (pVVar10->els_num <= (ulong)(pMVar68->u).reg)) {
LAB_0016fd09:
            pcStack_398 = (code *)0x16fd11;
            rewrite_insn_cold_18();
LAB_0016fd11:
            pcStack_398 = (code *)0x16fd33;
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar72 == 0) && (*(int *)&pgVar55->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar48 = pVVar10->varr[(pMVar68->u).reg], 0x21 < uVar48)) {
            pMVar27 = pgVar58->ctx;
            pcStack_398 = (code *)0x16f8ea;
            MVar22 = MIR_reg_type(pMVar27,paStack_2c8->reg - 0x21,(pgVar58->curr_func_item->u).func)
            ;
            uVar48 = uVar48 - 0x22;
            if (pgVar58->target_ctx->keep_fp_p == '\0') {
              MVar44 = (ulong)uVar48 << 3;
            }
            else {
              lVar43 = -0xb0;
              if (((pgVar58->curr_func_item->u).func)->vararg_p == '\0') {
                lVar43 = 0;
              }
              MVar44 = lVar43 + (ulong)((MVar22 == MIR_T_LD) + 1 + uVar48) * -8;
            }
            auVar2 = *(undefined1 (*) [32])pMStack_2c0;
            MVar23 = ((anon_union_32_12_57d33f68_for_u *)&pgVar55->addr_insn_p)->reg;
            MStack_240.u._16_8_ = SUB328((pMStack_2c0->u).mem,0x10);
            MStack_240.u.mem.disp = (pMStack_2c0->u).mem.disp;
            MStack_240.data._0_4_ = auVar2._0_4_;
            MStack_240.data._4_4_ = auVar2._4_4_;
            MStack_240._8_8_ = auVar2._8_8_;
            MStack_240.u.i = auVar2._16_8_;
            MStack_240.u.str.s = auVar2._24_8_;
            pcStack_398 = (code *)0x16f98d;
            _MIR_new_var_mem_op(&MStack_270,pMVar27,MVar22,MVar44,base_reg,0xffffffff,'\0');
            pMVar31 = pMStack_2b8;
            pFVar51 = pgVar55->debug_file;
            if ((int)((ulong)pFVar51 >> 0x20) < 1) {
              pcStack_398 = (code *)0x16fa3c;
              iVar38 = find_insn_pattern(pgVar58,(MIR_insn_t)pgVar55,(int *)0x0);
              pMVar31 = pMStack_2b8;
              if (iVar38 < 0) goto LAB_0016faa5;
            }
            else {
              uVar53 = 0;
              uVar48 = 0;
              paVar46 = paStack_2c8;
              do {
                if ((*(char *)((long)paVar46 + -8) == '\x02') && (paVar46->reg == MVar23)) {
                  auVar2._4_4_ = MStack_270.data._4_4_;
                  auVar2._0_4_ = (MIR_reg_t)MStack_270.data;
                  auVar2._8_8_ = MStack_270._8_8_;
                  auVar2._16_8_ = MStack_270.u.i;
                  auVar2._24_8_ = MStack_270.u.str.s;
                  aVar18.str.s = MStack_270.u.str.s;
                  aVar18.i = MStack_270.u.i;
                  aVar18._16_8_ = MStack_270.u._16_8_;
                  aVar18.mem.disp = MStack_270.u.mem.disp;
                  *paVar46 = aVar18;
                  *(undefined1 (*) [32])((long)paVar46 + -0x10) = auVar2;
                  if (1 < (int)uVar48) goto LAB_0016fd11;
                  lVar43 = (long)(int)uVar48;
                  uVar48 = uVar48 + 1;
                  aiStack_1b0[lVar43] = (int)uVar53;
                }
                uVar53 = uVar53 + 1;
                paVar46 = (anon_union_32_12_57d33f68_for_u *)((long)paVar46 + 0x30);
              } while ((ulong)pFVar51 >> 0x20 != uVar53);
              pcStack_398 = (code *)0x16fa19;
              iVar38 = find_insn_pattern(pgVar58,(MIR_insn_t)pgVar55,(int *)0x0);
              if (iVar38 < 0) {
                if (0 < (int)uVar48) {
                  uVar53 = 0;
                  do {
                    iVar38 = aiStack_1b0[uVar53];
                    auVar19._4_4_ = MStack_240.data._4_4_;
                    auVar19._0_4_ = (MIR_reg_t)MStack_240.data;
                    auVar19._8_8_ = MStack_240._8_8_;
                    auVar19._16_8_ = MStack_240.u.i;
                    auVar19._24_8_ = MStack_240.u.str.s;
                    aVar20.str.s = MStack_240.u.str.s;
                    aVar20.i = MStack_240.u.i;
                    aVar20._16_8_ = MStack_240.u._16_8_;
                    aVar20.mem.disp = MStack_240.u.mem.disp;
                    uVar53 = uVar53 + 1;
                    pMStack_2c0[iVar38].u = aVar20;
                    *(undefined1 (*) [32])(pMStack_2c0 + iVar38) = auVar19;
                  } while (uVar48 != uVar53);
                }
                goto LAB_0016faa5;
              }
            }
          }
          else {
LAB_0016faa5:
            pcStack_398 = (code *)0x16fade;
            MVar23 = change_reg(pgVar58,&MStack_2a0,(pMVar68->u).reg,base_reg,MVar21,
                                (MIR_insn_t)pgVar55,iStack_2cc);
            if (MVar23 == 0xffffffff) {
              auVar16._8_8_ = MStack_2a0._8_8_;
              auVar16._0_8_ = MStack_2a0.data;
              auVar16._16_8_ = MStack_2a0.u.i;
              auVar16._24_8_ = MStack_2a0.u.str.s;
              aVar17.str.s = MStack_2a0.u.str.s;
              aVar17.i = MStack_2a0.u.i;
              aVar17._16_8_ = MStack_2a0.u._16_8_;
              aVar17.mem.disp = MStack_2a0.u.mem.disp;
              pMVar68->u = aVar17;
              *(undefined1 (*) [32])pMVar68 = auVar16;
            }
            else {
              (pMVar68->u).reg = MVar23;
            }
          }
        }
        sVar72 = sVar72 + 1;
      } while (sVar72 != sStack_2b0);
      pFVar51 = pgVar55->debug_file;
    }
    pMVar68 = pMStack_2c0;
    iVar38 = 0;
    if (((ulong)pFVar51 & 0xfffffffc) == 0) {
      uVar15 = *(undefined8 *)((long)&pMStack_2c0->u + 8);
      pcStack_398 = (code *)0x16fb85;
      op1_00._12_4_ = (int)((ulong)*(undefined8 *)&pMStack_2c0->field_0x8 >> 0x20);
      op1_00.data = pMStack_2c0->data;
      op1_00._8_4_ = *(undefined4 *)&pMStack_2c0->field_0x8;
      op1_00.u.i = (pMStack_2c0->u).i;
      op1_00.u.mem.nonalias = (int)uVar15;
      op1_00.u.mem.nloc = (int)((ulong)uVar15 >> 0x20);
      op1_00.u._16_8_ = *(undefined8 *)((long)&pMStack_2c0->u + 0x10);
      op1_00.u.mem.disp = (pMStack_2c0->u).mem.disp;
      iVar24 = MIR_op_eq_p(pMVar60,op1_00,*(MIR_op_t *)&pgVar55->temp_bitmap);
      iVar38 = 0;
      if (iVar24 != 0) {
        if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          pcStack_398 = (code *)0x16fbc7;
          fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar58->debug_file);
          pcStack_398 = (code *)0x16fbe9;
          MIR_output_insn(pMVar60,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                          (pgVar58->curr_func_item->u).func,0);
          pcStack_398 = (code *)0x16fc03;
          fwrite(" which was ",0xb,1,(FILE *)pgVar58->debug_file);
          (pMVar68->u).i = iStack_200;
          (pMVar68->u).str.s = pcStack_1f8;
          *(undefined8 *)((long)&pMVar68->u + 0x10) = uStack_1f0;
          (pMVar68->u).mem.disp = MStack_1e8;
          pMVar68->data = apvStack_210[0];
          *(void **)&pMVar68->field_0x8 = apvStack_210[1];
          (pMVar68->u).i = iStack_200;
          (pMVar68->u).str.s = pcStack_1f8;
          pgVar55->temp_bitmap3 = pVStack_1d0;
          pgVar55->call_used_hard_regs[0] = pVStack_1c8;
          pgVar55->call_used_hard_regs[1] = pVStack_1c0;
          pgVar55->call_used_hard_regs[2] = pVStack_1b8;
          pgVar55->temp_bitmap = pVStack_1e0;
          pgVar55->temp_bitmap2 = pVStack_1d8;
          pgVar55->temp_bitmap3 = pVStack_1d0;
          pgVar55->call_used_hard_regs[0] = pVStack_1c8;
          pcStack_398 = (code *)0x16fc5d;
          MIR_output_insn(pMVar60,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                          (pgVar58->curr_func_item->u).func,1);
        }
        if ((((pgVar58->optimize_level != 0) &&
             (pMVar27 = pgVar55->ctx, pMVar27 != (MIR_context_t)0x0)) &&
            ((MIR_context_t)pMVar27->temp_string[3].size == pMVar27)) &&
           ((MIR_context_t)pMVar27->temp_string[3].varr == pMVar27)) {
          pcStack_398 = (code *)0x16fc8e;
          pMVar31 = MIR_new_insn_arr(pgVar58->ctx,MIR_USE,0,(MIR_op_t *)0x0);
          pcStack_398 = (code *)0x16fca4;
          MIR_insert_insn_before
                    (pgVar58->ctx,pgVar58->curr_func_item,(MIR_insn_t_conflict)pMVar27->gen_ctx,
                     pMVar31);
          pcStack_398 = (code *)0x16fcb5;
          add_new_bb_insn(pgVar58,pMVar31,(bb_t_conflict)pMVar27->temp_string,0);
        }
        pcStack_398 = (code *)0x16fcc0;
        gen_delete_insn(pgVar58,(MIR_insn_t)pgVar55);
        iVar38 = 1;
      }
    }
    return iVar38;
  }
  if ((int)(uStack_2d4 & uStack_2d0) < 0) {
LAB_0016fdfe:
    pcStack_398 = (code *)0x16fe1d;
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar27 = pgVar58->ctx;
  uVar53 = (ulong)uStack_2d4;
  paVar46 = (anon_union_32_12_57d33f68_for_u *)(ulong)uStack_2d0;
  uVar48 = uStack_2d4;
  if (-1 < (int)uStack_2d0) {
    uVar48 = uStack_2d0;
  }
  uVar30 = (ulong)pMStack_2c0[(int)uVar48].u.mem.base;
  uVar59 = (ulong)pMStack_2c0[(int)uVar48].u.mem.index;
  if (-1 < (int)(uStack_2d4 | uStack_2d0)) {
    pMVar68 = pMStack_2c0 + uVar53;
    uVar15 = *(undefined8 *)((long)&pMVar68->u + 8);
    pcStack_398 = (code *)0x16ef15;
    op1._12_4_ = (int)((ulong)*(undefined8 *)&pMVar68->field_0x8 >> 0x20);
    op1.data = pMVar68->data;
    op1._8_4_ = *(undefined4 *)&pMVar68->field_0x8;
    op1.u.i = (pMVar68->u).i;
    op1.u.mem.nonalias = (int)uVar15;
    op1.u.mem.nloc = (int)((ulong)uVar15 >> 0x20);
    op1.u._16_8_ = *(undefined8 *)((long)&pMStack_2c0[uVar53].u + 0x10);
    op1.u.mem.disp = pMStack_2c0[uVar53].u.mem.disp;
    op2.u._16_8_ = *(undefined8 *)((long)&pMStack_2c0[(long)paVar46].u + 0x10);
    op2._0_32_ = *(undefined1 (*) [32])(pMStack_2c0 + (long)paVar46);
    op2.u.mem.disp = pMStack_2c0[(long)paVar46].u.mem.disp;
    iVar38 = MIR_op_eq_p(pMVar27,op1,op2);
    if (iVar38 == 0) {
      pcStack_398 = (code *)0x16fe99;
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
    prVar29 = pgVar58->ra_ctx;
  }
  pVVar10 = prVar29->reg_renumber;
  paStack_2c8 = paVar46;
  if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
     (pVVar10->els_num <= uVar30)) {
LAB_0016fdc8:
    pcStack_398 = (code *)0x16fdcd;
    rewrite_insn_cold_20();
  }
  else {
    pcStack_398 = (code *)0x16efa3;
    add_ld_st(pgVar58,&MStack_240,pVVar10->varr[uVar30],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar55,0);
    pMVar68 = pMStack_2c0;
    pVVar10 = pgVar58->ra_ctx->reg_renumber;
    if (((pVVar10 != (VARR_MIR_reg_t *)0x0) && (pVVar10->varr != (MIR_reg_t *)0x0)) &&
       (uVar59 < pVVar10->els_num)) {
      pcStack_398 = (code *)0x16f01f;
      add_ld_st(pgVar58,&MStack_240,pVVar10->varr[uVar59],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar55,0);
      pcStack_398 = (code *)0x16f034;
      _MIR_new_var_op(pMVar27,10);
      pcStack_398 = (code *)0x16f049;
      _MIR_new_var_op(pMVar27,0xb);
      bVar3 = pMVar68[(int)uVar48].u.mem.scale;
      uVar30 = (ulong)bVar3;
      if (bVar3 == 0) {
        iVar32 = -1;
LAB_0016f08a:
        pcStack_398 = (code *)0x16f09d;
        MIR_new_int_op(pMVar27,iVar32);
        pcStack_398 = (code *)0x16f0ef;
        pMVar31 = MIR_new_insn(pMVar27,MIR_LSH);
        pcStack_398 = (code *)0x16f100;
        gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,pMVar31);
        if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          pcStack_398 = (code *)0x16f126;
          fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
          pcStack_398 = (code *)0x16f143;
          MIR_output_insn(pMVar27,pgVar58->debug_file,pMVar31,(pgVar58->curr_func_item->u).func,1);
        }
      }
      else if (bVar3 != 1) {
        lVar43 = 0;
        uVar59 = uVar30;
        if ((bVar3 & 1) == 0) {
          do {
            lVar43 = lVar43 + 1;
            uVar30 = uVar59 >> 1;
            uVar41 = uVar59 & 2;
            uVar59 = uVar30;
          } while (uVar41 == 0);
        }
        iVar32 = -1;
        if (uVar30 == 1) {
          iVar32 = lVar43;
        }
        goto LAB_0016f08a;
      }
      pcStack_398 = (code *)0x16f19c;
      pMVar31 = MIR_new_insn(pMVar27,MIR_ADD);
      pcStack_398 = (code *)0x16f1ad;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,pMVar31);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_398 = (code *)0x16f1d3;
        fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
        pcStack_398 = (code *)0x16f1f0;
        MIR_output_insn(pMVar27,pgVar58->debug_file,pMVar31,(pgVar58->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_2d0) {
        *(undefined8 *)((long)&pMStack_2c0[(long)paStack_2c8].u + 0x10) = 0xffffffff0000000a;
      }
      if (-1 < (int)uStack_2d4) {
        *(undefined8 *)((long)&pMStack_2c0[uVar53].u + 0x10) = 0xffffffff0000000a;
      }
      pcStack_398 = (code *)0x16f25c;
      get_reload_hreg(pgVar58,0xffffffff,6,0);
      goto LAB_0016f25c;
    }
  }
  pcStack_398 = (code *)0x16fdd2;
  rewrite_insn_cold_19();
LAB_0016fdd2:
  pcStack_398 = (code *)0x16fdd7;
  rewrite_insn_cold_17();
LAB_0016fdd7:
  pcStack_398 = (code *)0x16fdf9;
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
}

Assistant:

static int available_hreg_p (int hreg, MIR_reg_t type, int nregs, bitmap_t *conflict_locs,
                             live_range_t lr) {
  for (int j = lr->start; j <= lr->finish; j++) {
    if (bitmap_bit_p (conflict_locs[j], hreg)) return FALSE;
    if (nregs > 1) {
      if (target_nth_loc (hreg, type, nregs - 1) > MAX_HARD_REG) return FALSE;
      for (int k = nregs - 1; k > 0; k--) {
        MIR_reg_t curr_hreg = target_nth_loc (hreg, type, k);
        if (bitmap_bit_p (conflict_locs[j], curr_hreg)) return FALSE;
      }
    }
  }
  return TRUE;
}